

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_arrayreverse(HSQUIRRELVM v,SQInteger idx)

{
  bool bVar1;
  SQInteger SVar2;
  SQObjectPtr *pSVar3;
  SQObjectPtr *this;
  SQUnsignedInteger local_68;
  SQInteger i;
  SQInteger n;
  SQInteger size;
  SQObjectPtr t;
  SQArray *arr;
  SQObjectPtr *o;
  SQInteger idx_local;
  HSQUIRRELVM v_local;
  
  o = (SQObjectPtr *)idx;
  idx_local = (SQInteger)v;
  SVar2 = sq_gettop(v);
  if (SVar2 < 1) {
    SQVM::Raise_Error((SQVM *)idx_local,"not enough params in the stack");
    v_local = (HSQUIRRELVM)0xffffffffffffffff;
  }
  else {
    bVar1 = sq_aux_gettypedarg((HSQUIRRELVM)idx_local,(SQInteger)o,OT_ARRAY,(SQObjectPtr **)&arr);
    if (bVar1) {
      t.super_SQObject._unVal = (SQObjectValue)(arr->super_SQCollectable).super_SQRefCounted._uiRef;
      SVar2 = SQArray::Size(t.super_SQObject._unVal.pArray);
      if (SVar2 < 1) {
        v_local = (HSQUIRRELVM)0x0;
      }
      else {
        SQObjectPtr::SQObjectPtr((SQObjectPtr *)&size);
        SVar2 = SQArray::Size(t.super_SQObject._unVal.pArray);
        for (local_68 = 0; (long)local_68 < SVar2 >> 1; local_68 = local_68 + 1) {
          pSVar3 = sqvector<SQObjectPtr>::operator[]
                             ((sqvector<SQObjectPtr> *)
                              &((t.super_SQObject._unVal.pTable)->super_SQDelegable)._delegate,
                              local_68);
          SQObjectPtr::operator=((SQObjectPtr *)&size,pSVar3);
          pSVar3 = sqvector<SQObjectPtr>::operator[]
                             ((sqvector<SQObjectPtr> *)
                              &((t.super_SQObject._unVal.pTable)->super_SQDelegable)._delegate,
                              (SVar2 + -1) - local_68);
          this = sqvector<SQObjectPtr>::operator[]
                           ((sqvector<SQObjectPtr> *)
                            &((t.super_SQObject._unVal.pTable)->super_SQDelegable)._delegate,
                            local_68);
          SQObjectPtr::operator=(this,pSVar3);
          pSVar3 = sqvector<SQObjectPtr>::operator[]
                             ((sqvector<SQObjectPtr> *)
                              &((t.super_SQObject._unVal.pTable)->super_SQDelegable)._delegate,
                              (SVar2 + -1) - local_68);
          SQObjectPtr::operator=(pSVar3,(SQObjectPtr *)&size);
        }
        v_local = (HSQUIRRELVM)0x0;
        SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&size);
      }
    }
    else {
      v_local = (HSQUIRRELVM)0xffffffffffffffff;
    }
  }
  return (SQRESULT)v_local;
}

Assistant:

SQRESULT sq_arrayreverse(HSQUIRRELVM v,SQInteger idx)
{
    sq_aux_paramscheck(v, 1);
    SQObjectPtr *o;
    _GETSAFE_OBJ(v, idx, OT_ARRAY,o);
    SQArray *arr = _array(*o);
    if(arr->Size() > 0) {
        SQObjectPtr t;
        SQInteger size = arr->Size();
        SQInteger n = size >> 1; size -= 1;
        for(SQInteger i = 0; i < n; i++) {
            t = arr->_values[i];
            arr->_values[i] = arr->_values[size-i];
            arr->_values[size-i] = t;
        }
        return SQ_OK;
    }
    return SQ_OK;
}